

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colorTracker.cpp
# Opt level: O1

vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *
ColorTracker::getMaxAreaContour
          (vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *__return_storage_ptr__,
          vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
          *contours)

{
  pointer pvVar1;
  undefined1 auVar2 [16];
  runtime_error *this;
  undefined8 *puVar3;
  long *plVar4;
  size_type *psVar5;
  pointer pPVar6;
  long *plVar7;
  double *pdVar8;
  double *pdVar9;
  ulong uVar10;
  double *pdVar11;
  pointer pvVar12;
  undefined1 auVar13 [16];
  vector<double,_std::allocator<double>_> area;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> contour;
  vector<double,_std::allocator<double>_> local_188;
  long lStack_170;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  *local_160;
  runtime_error *local_158;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> local_150;
  long lStack_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pvVar12 = (contours->
            super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pvVar1 = (contours->
           super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_160 = contours;
  local_158 = (runtime_error *)__return_storage_ptr__;
  if (pvVar12 == pvVar1) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/seritake[P]TwoDimetionalInvertedPendlum/src/trackModule/colorTracker.cpp"
               ,"");
    std::operator+(&local_70,"in ",&local_b0);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_70);
    auVar2._8_8_ = &local_f0.field_2;
    auVar2._0_8_ = plVar4;
    auVar13._8_8_ = (size_type *)*plVar4;
    auVar13._0_8_ = plVar4;
    psVar5 = (size_type *)(plVar4 + 2);
    if ((size_type *)*plVar4 == psVar5) {
      local_f0.field_2._M_allocated_capacity = *psVar5;
      local_f0.field_2._8_8_ = plVar4[3];
      goto LAB_00112691;
    }
  }
  else {
    local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (double *)0x0;
    local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (double *)0x0;
    local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (double *)0x0;
    do {
      std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::vector(&local_150,pvVar12);
      local_110.field_2._M_allocated_capacity = 0;
      local_110._M_dataplus._M_p._0_4_ = 0x8103000c;
      local_110._M_string_length = (size_type)&local_150;
      local_130._M_dataplus._M_p = (pointer)cv::contourArea((_InputArray *)&local_110,false);
      if (local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (&local_188,
                   (iterator)
                   local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish,(double *)&local_130);
      }
      else {
        *local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish = (double)local_130._M_dataplus._M_p;
        local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      if (local_150.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_150.
                        super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      this = local_158;
      pvVar12 = pvVar12 + 1;
    } while (pvVar12 != pvVar1);
    pdVar8 = local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start + 1;
    pdVar9 = local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar11 = local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (pdVar8 != local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish &&
        local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        pdVar9 = pdVar8;
        if (*pdVar8 < *pdVar11 || *pdVar8 == *pdVar11) {
          pdVar9 = pdVar11;
        }
        pdVar8 = pdVar8 + 1;
        pdVar11 = pdVar9;
      } while (pdVar8 != local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish);
    }
    uVar10 = (long)pdVar9 -
             (long)local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3;
    pvVar12 = (local_160->
              super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    psVar5 = (size_type *)
             ((long)(local_160->
                    super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar12 >> 3);
    if (uVar10 <= (ulong)((long)psVar5 * -0x5555555555555555) &&
        (long)psVar5 * -0x5555555555555555 - uVar10 != 0) {
      std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::vector
                ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)local_158,
                 pvVar12 + uVar10);
      if (local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (double *)0x0) {
        operator_delete(local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      return (vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)this;
    }
    auVar13 = std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                        );
  }
  local_f0.field_2._M_allocated_capacity = *psVar5;
  auVar2 = auVar13;
LAB_00112691:
  local_f0._M_dataplus._M_p = auVar2._8_8_;
  puVar3 = auVar2._0_8_;
  local_f0._M_string_length = puVar3[1];
  *puVar3 = psVar5;
  puVar3[1] = 0;
  *(undefined1 *)(puVar3 + 2) = 0;
  std::__cxx11::to_string(&local_90,0x110);
  std::operator+(&local_50,&local_f0,&local_90);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_130._M_dataplus._M_p = (pointer)*plVar4;
  psVar5 = (size_type *)(plVar4 + 2);
  if ((size_type *)local_130._M_dataplus._M_p == psVar5) {
    local_130.field_2._M_allocated_capacity = *psVar5;
    local_130.field_2._8_8_ = plVar4[3];
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  }
  else {
    local_130.field_2._M_allocated_capacity = *psVar5;
  }
  local_130._M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"getMaxAreaContour","");
  std::operator+(&local_110,&local_130,&local_d0);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_110);
  local_150.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)*plVar4;
  pPVar6 = (pointer)(plVar4 + 2);
  if (local_150.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
      super__Vector_impl_data._M_start == pPVar6) {
    local_150.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = *(pointer *)pPVar6;
    lStack_138 = plVar4[3];
    local_150.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)&local_150.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  else {
    local_150.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = *(pointer *)pPVar6;
  }
  local_150.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)plVar4[1];
  *plVar4 = (long)pPVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_150);
  local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)*plVar4;
  plVar7 = plVar4 + 2;
  if (local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start == (pointer)plVar7) {
    local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)*plVar7;
    lStack_170 = plVar4[3];
    local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)&local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
  }
  else {
    local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)*plVar7;
  }
  local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)plVar4[1];
  *plVar4 = (long)plVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::runtime_error::runtime_error(this,(string *)&local_188);
  *(undefined ***)this = &PTR__runtime_error_0011e9d8;
  __cxa_throw(this,&ProcessingException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

vector<Point> ColorTracker::getMaxAreaContour(const vector<vector<Point>>& contours) noexcept(false){
    if(contours.empty()){
        //cout << "given contours list length is 0" << endl;
        throw ProcessingException(WHERE + "invalid input: given contours list length is 0");
    }
    
    vector<double> area;
    for(vector<Point> contour : contours){
        area.push_back(cv::contourArea(contour));
    }

    auto maxIter = std::max_element(area.begin(),area.end());
    auto maxIndex = std::distance(area.begin(),maxIter);

    return contours.at(maxIndex);
}